

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::FinishPartialCollect
          (SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,RecyclerSweep *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar6;
  SmallHeapBlockT<SmallAllocationBlockAttributes> **ppSVar7;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *list;
  anon_class_16_2_3fe61e0b fn;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *local_30;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail;
  
  if (recyclerSweep == (RecyclerSweep *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  }
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ,bVar2);
  pRVar4 = HeapBucket::GetRecycler((HeapBucket *)this);
  if (pRVar4->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x253,"(this->GetRecycler()->inPartialCollectMode)",
                       "this->GetRecycler()->inPartialCollectMode");
    if (!bVar2) goto LAB_006b2f83;
    *puVar5 = 0;
  }
  if (recyclerSweep != (RecyclerSweep *)0x0) {
    bVar2 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
            IsAllocationStopped(&this->
                                 super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                               );
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,600,"(recyclerSweep == nullptr || this->IsAllocationStopped())",
                         "recyclerSweep == nullptr || this->IsAllocationStopped()");
      if (!bVar2) goto LAB_006b2f83;
      *puVar5 = 0;
    }
  }
  list = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)this->partialSweptHeapBlockList;
  if (list == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    list = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)this->partialHeapBlockList;
  }
  else {
    this->partialSweptHeapBlockList =
         (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    local_30 = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    fn.tail = &local_30;
    fn.this = this;
    HeapBlockList::
    ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::FinishPartialCollect(Memory::RecyclerSweep*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
              ((SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)list,fn);
    if (local_30 == (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x268,"(tail != nullptr)","tail != nullptr");
      if (!bVar2) {
LAB_006b2f83:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    (local_30->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next =
         (SmallHeapBlockT<SmallAllocationBlockAttributes> *)this->partialHeapBlockList;
    this->partialHeapBlockList =
         (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)list;
  }
  if (recyclerSweep == (RecyclerSweep *)0x0) {
    if (list != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this->partialHeapBlockList =
           (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
      AppendAllocableHeapBlockList
                (&this->
                  super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                 ,(SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)list);
    }
    bVar2 = false;
  }
  else {
    if (list != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this->partialHeapBlockList =
           (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar6 = (this->
               super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
               ).heapBlockList;
      if (pSVar6 == (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        ppSVar7 = (SmallHeapBlockT<SmallAllocationBlockAttributes> **)
                  &(this->
                   super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                   ).heapBlockList;
      }
      else {
        pSVar6 = HeapBlockList::
                 Tail<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                           (pSVar6);
        ppSVar7 = &(pSVar6->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                   super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
      }
      *ppSVar7 = list;
    }
    uVar3 = HeapBucket::GetBucketIndex((HeapBucket *)this);
    if ((recyclerSweep->withBarrierData).bucketData[uVar3].pendingSweepList ==
        (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
      StartAllocationAfterSweep
                (&this->
                  super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                );
    }
    bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  }
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ,bVar2);
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::FinishPartialCollect(RecyclerSweep * recyclerSweep)
{
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep != nullptr && recyclerSweep->IsBackground()));

    Assert(this->GetRecycler()->inPartialCollectMode);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(recyclerSweep == nullptr || this->IsAllocationStopped() || this->AllocationsStartedDuringConcurrentSweep());
#else
    Assert(recyclerSweep == nullptr || this->IsAllocationStopped());
#endif

#if ENABLE_CONCURRENT_GC
    // Process the partial Swept block and move it to the partial heap block list
    TBlockType * partialSweptList = this->partialSweptHeapBlockList;
    if (partialSweptList)
    {
        this->partialSweptHeapBlockList = nullptr;
        TBlockType *  tail = nullptr;
        HeapBlockList::ForEach(partialSweptList, [this, &tail](TBlockType * heapBlock)
        {
            heapBlock->FinishPartialCollect();
            Assert(heapBlock->HasFreeObject());
            tail = heapBlock;
        });
        Assert(tail != nullptr);
        tail->SetNextBlock(this->partialHeapBlockList);
        this->partialHeapBlockList = partialSweptList;
    }
#endif

    TBlockType * currentPartialHeapBlockList = this->partialHeapBlockList;
    if (recyclerSweep == nullptr)
    {
        if (currentPartialHeapBlockList != nullptr)
        {
            this->partialHeapBlockList = nullptr;
            this->AppendAllocableHeapBlockList(currentPartialHeapBlockList);
        }
    }
    else
    {
        if (currentPartialHeapBlockList != nullptr)
        {
            this->partialHeapBlockList = nullptr;
            TBlockType * list = this->heapBlockList;
            if (list == nullptr)
            {
                this->heapBlockList = currentPartialHeapBlockList;
            }
            else
            {
                // CONCURRENT-TODO: Optimize this?
                TBlockType * tail = HeapBlockList::Tail(this->heapBlockList);
                tail->SetNextBlock(currentPartialHeapBlockList);
            }
        }
#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        if (recyclerSweep->GetPendingSweepBlockList(this) == nullptr && !this->AllocationsStartedDuringConcurrentSweep())
#else
        if (recyclerSweep->GetPendingSweepBlockList(this) == nullptr)
#endif
#endif
        {
            // nothing else to sweep now,  we can start allocating now.
            this->StartAllocationAfterSweep();
        }
    }

    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep != nullptr && recyclerSweep->IsBackground()));
}